

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O1

bool __thiscall Assimp::DefaultIOSystem::ComparePaths(DefaultIOSystem *this,char *one,char *second)

{
  int iVar1;
  bool bVar2;
  string temp1;
  string temp2;
  string local_50;
  string local_30;
  
  iVar1 = strcasecmp(one,second);
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else {
    MakeAbsolutePath_abi_cxx11_(&local_50,one);
    MakeAbsolutePath_abi_cxx11_(&local_30,second);
    if ((int)local_30._M_string_length == (int)local_50._M_string_length) {
      iVar1 = strcasecmp(local_50._M_dataplus._M_p,local_30._M_dataplus._M_p);
      bVar2 = iVar1 == 0;
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return bVar2;
}

Assistant:

bool DefaultIOSystem::ComparePaths(const char* one, const char* second) const
{
    // chances are quite good both paths are formatted identically,
    // so we can hopefully return here already
    if (!ASSIMP_stricmp(one, second))
        return true;

    std::string temp1 = MakeAbsolutePath(one);
    std::string temp2 = MakeAbsolutePath(second);

    return !ASSIMP_stricmp(temp1, temp2);
}